

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

void __thiscall E64::settings_t::write_current_path_to_settings(settings_t *this)

{
  FILE *__stream;
  char *pcVar1;
  
  chdir(this->settings_path);
  __stream = fopen("PATH","w");
  for (pcVar1 = this->current_path; *pcVar1 != '\0'; pcVar1 = pcVar1 + 1) {
    fputc((int)*pcVar1,__stream);
  }
  fclose(__stream);
  return;
}

Assistant:

void E64::settings_t::write_current_path_to_settings()
{
	chdir(settings_path);
	FILE *temp_file = fopen("PATH", "w");

	char *temp_char = current_path;

	while (*temp_char != '\0') {
		fwrite(temp_char, 1, 1, temp_file);
		temp_char++;
	}
	fclose(temp_file);
}